

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O1

int64_t duckdb::Interval::GetMicro(interval_t *val)

{
  bool bVar1;
  ConversionException *pCVar2;
  int64_t micro_total;
  int64_t micro_day;
  int64_t micro_month;
  string local_58;
  int64_t local_38;
  int64_t local_30;
  int64_t local_28;
  
  local_38 = val->micros;
  bVar1 = TryMultiplyOperator::Operation<long,long,long>((long)val->months,0x25b7f3d4000,&local_28);
  if (!bVar1) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Could not convert Month to Microseconds","");
    ConversionException::ConversionException(pCVar2,&local_58);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryMultiplyOperator::Operation<long,long,long>((long)val->days,86400000000,&local_30);
  if (!bVar1) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Could not convert Day to Microseconds","");
    ConversionException::ConversionException(pCVar2,&local_58);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryAddOperator::Operation<long,long,long>(local_38,local_28,&local_38);
  if (!bVar1) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Could not convert Interval to Microseconds","");
    ConversionException::ConversionException(pCVar2,&local_58);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryAddOperator::Operation<long,long,long>(local_38,local_30,&local_38);
  if (bVar1) {
    return local_38;
  }
  pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Could not convert Interval to Microseconds","");
  ConversionException::ConversionException(pCVar2,&local_58);
  __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Interval::GetMicro(const interval_t &val) {
	int64_t micro_month, micro_day, micro_total;
	micro_total = val.micros;
	if (!TryMultiplyOperator::Operation((int64_t)val.months, MICROS_PER_MONTH, micro_month)) {
		throw ConversionException("Could not convert Month to Microseconds");
	}
	if (!TryMultiplyOperator::Operation((int64_t)val.days, MICROS_PER_DAY, micro_day)) {
		throw ConversionException("Could not convert Day to Microseconds");
	}
	if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(micro_total, micro_month, micro_total)) {
		throw ConversionException("Could not convert Interval to Microseconds");
	}
	if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(micro_total, micro_day, micro_total)) {
		throw ConversionException("Could not convert Interval to Microseconds");
	}

	return micro_total;
}